

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O0

void __thiscall
bm::Mark::Mark<long,std::ratio<1l,1000000000l>>
          (Mark *this,duration<long,_std::ratio<1L,_1000000000L>_> *duration)

{
  duration<long,_std::ratio<1L,_1000000000L>_> *duration_local;
  Mark *this_local;
  
  std::function<void_(const_bm::Mark_&)>::function(&this->_overflow_callback);
  clear(this);
  add<long,std::ratio<1l,1000000000l>>(this,duration);
  return;
}

Assistant:

explicit Mark(const std::chrono::duration<Rep, Period>& duration)
    {
        clear();
        (void)add(duration);
    }